

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

any __thiscall
cs_impl::
cni_helper<cs_impl::any_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::call(cni_helper<cs_impl::any_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
       *this,vector *args)

{
  runtime_error *this_00;
  long *plVar1;
  size_type *psVar2;
  sequence<0> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  _Any_data local_a0 [2];
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (*(long *)(in_RDX + 8) - *(long *)in_RDX == 8) {
    _call<0>((cni_helper<cs_impl::any_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
              *)local_a0,args,in_RDX);
    if ((_func_void *)local_a0[0]._0_8_ != (_func_void *)0x0) {
      *(long *)(local_a0[0]._M_unused._M_function_pointer + 8) =
           *(long *)(local_a0[0]._M_unused._M_function_pointer + 8) + 1;
    }
    *(undefined8 *)&(this->mFunc).super__Function_base._M_functor = local_a0[0]._M_unused._M_object;
    any::recycle((any *)local_a0);
    return (any)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_60,1);
  std::operator+(&local_40,"Wrong size of the arguments. Expected ",&local_60);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_c0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_c0._M_dataplus._M_p == psVar2) {
    local_c0.field_2._M_allocated_capacity = *psVar2;
    local_c0.field_2._8_8_ = plVar1[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar2;
  }
  local_c0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_80,*(long *)(in_RDX + 8) - *(long *)in_RDX >> 3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,&local_80);
  cs::runtime_error::runtime_error(this_00,(string *)local_a0);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}